

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zeroize.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  FILE *__stream;
  ulong uVar2;
  char buf [1024];
  
  if (argc == 2) {
    __stream = fopen(argv[1],"r");
    if (__stream != (FILE *)0x0) {
      for (uVar2 = 0; (iVar1 = fgetc(__stream), iVar1 != -1 && (uVar2 < 0x3ff)); uVar2 = uVar2 + 1)
      {
        buf[uVar2] = (char)iVar1;
      }
      buf[uVar2] = '\0';
      if (uVar2 == 0) {
        puts("The file is empty!");
      }
      else {
        puts(buf);
      }
      fclose(__stream);
      mbedtls_platform_zeroize(buf,0x400);
      return (uint)(uVar2 == 0);
    }
    printf("Could not open file \'%s\'\n",argv[1]);
  }
  else {
    puts("This program takes exactly 1 agument");
    usage();
  }
  return 1;
}

Assistant:

int main( int argc, char** argv )
{
    int exit_code = MBEDTLS_EXIT_FAILURE;
    FILE *fp;
    char buf[BUFFER_LEN];
    char *p = buf;
    char *end = p + BUFFER_LEN;
    int c;

    if( argc != 2 )
    {
        mbedtls_printf( "This program takes exactly 1 agument\n" );
        usage();
        return( exit_code );
    }

    fp = fopen( argv[1], "r" );
    if( fp == NULL )
    {
        mbedtls_printf( "Could not open file '%s'\n", argv[1] );
        return( exit_code );
    }

    while( ( c = fgetc( fp ) ) != EOF && p < end - 1 )
        *p++ = (char)c;
    *p = '\0';

    if( p - buf != 0 )
    {
        mbedtls_printf( "%s\n", buf );
        exit_code = MBEDTLS_EXIT_SUCCESS;
    }
    else
        mbedtls_printf( "The file is empty!\n" );

    fclose( fp );
    mbedtls_platform_zeroize( buf, sizeof( buf ) );

    return( exit_code );
}